

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::
     outputrows_splt<std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,period_occ_granular>
               (summarySampleslevelHeader *sh,sampleslevelRec *sr,FILE *outFile,
               map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
               *m_occ,vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp,
               OASIS_FLOAT impacted_exposure)

{
  pointer ppVar1;
  long lVar2;
  undefined8 uVar3;
  mapped_type *__x;
  mapped_type *pmVar4;
  long lVar5;
  pointer ppVar6;
  int iVar7;
  int occ_day;
  int occ_month;
  int occ_year;
  period_occ_granular p;
  char buffer [4096];
  
  if (outFile != (FILE *)0x0) {
    __x = std::
          map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
          ::operator[](m_occ,&sh->event_id);
    std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::operator=(vp,__x);
    ppVar6 = (vp->super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (vp->super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar6 != ppVar1) {
      do {
        iVar7 = granular_date_;
        p.period_no = ppVar6->period_no;
        p._4_4_ = *(undefined4 *)&ppVar6->field_0x4;
        lVar2 = ppVar6->occ_date_id;
        lVar5 = 0x5a0;
        if (granular_date_ == 0) {
          lVar5 = 1;
        }
        p.occ_date_id = lVar2;
        d((long)(int)(lVar2 / lVar5),&occ_year,&occ_month,&occ_day);
        uVar3 = p._0_8_;
        iVar7 = ((int)lVar2 +
                (SUB164(SEXT816(lVar2) * SEXT816(0x2d82d82d82d82d83),9) -
                (SUB164(SEXT816(lVar2) * SEXT816(0x2d82d82d82d82d83),0xc) >> 0x1f)) * -0x5a0) *
                iVar7;
        pmVar4 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&p.period_no);
        iVar7 = sprintf(buffer,"%d,%f,%d,%d,%d,%d,%d,%d,%d,%d,%0.2f,%0.2f\n",SUB84(*pmVar4,0),
                        (double)sr->loss,(double)impacted_exposure,uVar3 & 0xffffffff,
                        (ulong)(uint)sh->event_id,(ulong)(uint)occ_year,(ulong)(uint)occ_month,
                        (ulong)(uint)occ_day,(ulong)(uint)(iVar7 / 0x3c),(ulong)(uint)(iVar7 % 0x3c)
                        ,(ulong)(uint)sh->summary_id,(ulong)(uint)sr->sidx);
        writeoutput(buffer,iVar7,outFile);
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar1);
    }
  }
  return;
}

Assistant:

void outputrows_splt(const summarySampleslevelHeader& sh,
			     const sampleslevelRec &sr, FILE * outFile,
			     moccT &m_occ, std::vector<periodT> &vp,
			     const OASIS_FLOAT impacted_exposure)
	{
#ifdef HAVE_PARQUET
		if (outFile == nullptr && os_.find(OasisParquet::SPLT) == os_.end())
#else
		if (outFile == nullptr)
#endif
		{
			return;
		}

		vp = m_occ[sh.event_id];
		for (auto p : vp) {
			int occ_year, occ_month, occ_day, occ_hour, occ_minute;
			getdates(p.occ_date_id, occ_year, occ_month, occ_day,
				 occ_hour, occ_minute);
			
			if (outFile != nullptr) {
				char buffer[4096];
				int strLen;
				strLen = sprintf(buffer, "%d,%f,%d,%d,%d,%d,%d,"
						 "%d,%d,%d,%0.2f,%0.2f\n",
						 p.period_no,
						 period_weights_[p.period_no],
						 sh.event_id, occ_year,
						 occ_month, occ_day, occ_hour,
						 occ_minute, sh.summary_id,
						 sr.sidx, sr.loss,
						 impacted_exposure);
				writeoutput(buffer, strLen, outFile);
			}
#ifdef HAVE_PARQUET
			if (os_.find(OasisParquet::SPLT) != os_.end()) {
				os_[OasisParquet::SPLT] << p.period_no
							<< (float)period_weights_[p.period_no]
							<< sh.event_id
							<< occ_year << occ_month
							<< occ_day << occ_hour
							<< occ_minute
							<< sh.summary_id
							<< sr.sidx
							<< (float)sr.loss
							<< (float)impacted_exposure
							<< parquet::EndRow;
			}
#endif

		}
	}